

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O0

void anon_unknown.dwarf_14174cb::SADTestBase::SetUpTestSuite(void)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffffe10;
  unsigned_short **in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  int line;
  char *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  Type type;
  AssertHelper *in_stack_fffffffffffffe40;
  AssertionResult local_190;
  Message *in_stack_fffffffffffffe88;
  AssertHelper *in_stack_fffffffffffffe90;
  AssertHelper *this;
  AssertionResult local_168 [2];
  undefined8 local_148;
  AssertionResult local_140 [2];
  undefined8 local_120;
  AssertionResult local_118 [2];
  undefined8 local_f8;
  AssertionResult local_f0 [2];
  undefined8 local_d0;
  AssertionResult local_c8 [2];
  undefined8 local_a8;
  AssertionResult local_a0 [2];
  undefined8 local_80;
  AssertionResult local_78 [2];
  undefined8 local_58;
  AssertionResult local_50;
  uint local_3c;
  undefined8 local_18;
  AssertionResult local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  (anonymous_namespace)::SADTestBase::source_data8_ =
       aom_memalign((size_t)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
  local_18 = 0;
  testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,(uchar **)in_stack_fffffffffffffe18
             ,&in_stack_fffffffffffffe10->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe40);
    testing::AssertionResult::failure_message((AssertionResult *)0xc3f0a7);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
               (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
    testing::Message::~Message((Message *)0xc3f104);
  }
  local_3c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3f18b);
  if (local_3c == 0) {
    (anonymous_namespace)::SADTestBase::reference_data8_ =
         aom_memalign((size_t)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
    local_58 = 0;
    testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               (uchar **)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe40);
      testing::AssertionResult::failure_message((AssertionResult *)0xc3f22f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                 (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
      testing::Message::~Message((Message *)0xc3f28c);
    }
    local_3c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3f313);
    if (local_3c == 0) {
      (anonymous_namespace)::SADTestBase::second_pred8_ =
           aom_memalign((size_t)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
      local_80 = 0;
      testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 (uchar **)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->data_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe40);
        in_stack_fffffffffffffe40 =
             (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xc3f3b7);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                   (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
        testing::Message::~Message((Message *)0xc3f414);
      }
      local_3c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3f49b);
      if (local_3c == 0) {
        (anonymous_namespace)::SADTestBase::comp_pred8_ =
             aom_memalign((size_t)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
        local_a8 = 0;
        testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                   (uchar **)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->data_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe40);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xc3f53f);
          type = (Type)((ulong)pcVar2 >> 0x20);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                     (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
          testing::Message::~Message((Message *)0xc3f59c);
        }
        local_3c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3f623);
        if (local_3c == 0) {
          (anonymous_namespace)::SADTestBase::comp_pred8_test_ =
               aom_memalign((size_t)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
          local_d0 = 0;
          testing::internal::CmpHelperNE<unsigned_char*,decltype(nullptr)>
                    (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                     (uchar **)in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->data_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffe40);
            in_stack_fffffffffffffe30 =
                 testing::AssertionResult::failure_message((AssertionResult *)0xc3f6c7);
            testing::internal::AssertHelper::AssertHelper
                      (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                       (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
            testing::internal::AssertHelper::operator=
                      (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
            testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
            testing::Message::~Message((Message *)0xc3f724);
          }
          local_3c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3f7ab);
          if (local_3c == 0) {
            (anonymous_namespace)::SADTestBase::source_data16_ =
                 aom_memalign((size_t)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
            local_f8 = 0;
            testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                      (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18
                       ,&in_stack_fffffffffffffe10->data_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe40);
              in_stack_fffffffffffffe28 =
                   testing::AssertionResult::failure_message((AssertionResult *)0xc3f84f);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                         (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
              testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
              testing::Message::~Message((Message *)0xc3f8ac);
            }
            local_3c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3f933);
            if (local_3c == 0) {
              (anonymous_namespace)::SADTestBase::reference_data16_ =
                   aom_memalign((size_t)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20)
              ;
              local_120 = 0;
              testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                        (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                         in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->data_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
              if (!bVar1) {
                testing::Message::Message((Message *)in_stack_fffffffffffffe40);
                in_stack_fffffffffffffe20 =
                     testing::AssertionResult::failure_message((AssertionResult *)0xc3f9d7);
                testing::internal::AssertHelper::AssertHelper
                          (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                           (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),in_stack_fffffffffffffe20
                          );
                testing::internal::AssertHelper::operator=
                          (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
                testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
                testing::Message::~Message((Message *)0xc3fa34);
              }
              local_3c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3fabb);
              if (local_3c == 0) {
                (anonymous_namespace)::SADTestBase::second_pred16_ =
                     aom_memalign((size_t)in_stack_fffffffffffffe28,
                                  (size_t)in_stack_fffffffffffffe20);
                local_148 = 0;
                testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                          (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                           in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->data_);
                bVar1 = testing::AssertionResult::operator_cast_to_bool(local_140);
                if (!bVar1) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffe40);
                  in_stack_fffffffffffffe18 =
                       (unsigned_short **)
                       testing::AssertionResult::failure_message((AssertionResult *)0xc3fb5f);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                             (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                             in_stack_fffffffffffffe20);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
                  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
                  testing::Message::~Message((Message *)0xc3fbbc);
                }
                local_3c = (uint)!bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3fc43);
                if (local_3c == 0) {
                  (anonymous_namespace)::SADTestBase::comp_pred16_ =
                       aom_memalign((size_t)in_stack_fffffffffffffe28,
                                    (size_t)in_stack_fffffffffffffe20);
                  this = (AssertHelper *)0x0;
                  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                             in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->data_);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
                  if (!bVar1) {
                    testing::Message::Message((Message *)in_stack_fffffffffffffe40);
                    in_stack_fffffffffffffe10 =
                         (AssertHelper *)
                         testing::AssertionResult::failure_message((AssertionResult *)0xc3fce7);
                    testing::internal::AssertHelper::AssertHelper
                              (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,
                               (int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                               in_stack_fffffffffffffe20);
                    testing::internal::AssertHelper::operator=(this,in_stack_fffffffffffffe88);
                    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
                    testing::Message::~Message((Message *)0xc3fd3b);
                  }
                  local_3c = (uint)!bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3fdbf);
                  if (local_3c == 0) {
                    (anonymous_namespace)::SADTestBase::comp_pred16_test_ =
                         aom_memalign((size_t)in_stack_fffffffffffffe28,
                                      (size_t)in_stack_fffffffffffffe20);
                    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                               in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->data_);
                    line = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
                    if (!bVar1) {
                      testing::Message::Message((Message *)in_stack_fffffffffffffe40);
                      testing::AssertionResult::failure_message((AssertionResult *)0xc3fe51);
                      testing::internal::AssertHelper::AssertHelper
                                (in_stack_fffffffffffffe40,type,in_stack_fffffffffffffe30,line,
                                 in_stack_fffffffffffffe20);
                      testing::internal::AssertHelper::operator=(this,in_stack_fffffffffffffe88);
                      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe10);
                      testing::Message::~Message((Message *)0xc3fe9d);
                    }
                    local_3c = (uint)!bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)0xc3ff15);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void SetUpTestSuite() {
    source_data8_ = reinterpret_cast<uint8_t *>(
        aom_memalign(kDataAlignment, kDataBlockSize));
    ASSERT_NE(source_data8_, nullptr);
    reference_data8_ = reinterpret_cast<uint8_t *>(
        aom_memalign(kDataAlignment, kDataBufferSize));
    ASSERT_NE(reference_data8_, nullptr);
    second_pred8_ =
        reinterpret_cast<uint8_t *>(aom_memalign(kDataAlignment, 128 * 128));
    ASSERT_NE(second_pred8_, nullptr);
    comp_pred8_ =
        reinterpret_cast<uint8_t *>(aom_memalign(kDataAlignment, 128 * 128));
    ASSERT_NE(comp_pred8_, nullptr);
    comp_pred8_test_ =
        reinterpret_cast<uint8_t *>(aom_memalign(kDataAlignment, 128 * 128));
    ASSERT_NE(comp_pred8_test_, nullptr);
    source_data16_ = reinterpret_cast<uint16_t *>(
        aom_memalign(kDataAlignment, kDataBlockSize * sizeof(uint16_t)));
    ASSERT_NE(source_data16_, nullptr);
    reference_data16_ = reinterpret_cast<uint16_t *>(
        aom_memalign(kDataAlignment, kDataBufferSize * sizeof(uint16_t)));
    ASSERT_NE(reference_data16_, nullptr);
    second_pred16_ = reinterpret_cast<uint16_t *>(
        aom_memalign(kDataAlignment, 128 * 128 * sizeof(uint16_t)));
    ASSERT_NE(second_pred16_, nullptr);
    comp_pred16_ = reinterpret_cast<uint16_t *>(
        aom_memalign(kDataAlignment, 128 * 128 * sizeof(uint16_t)));
    ASSERT_NE(comp_pred16_, nullptr);
    comp_pred16_test_ = reinterpret_cast<uint16_t *>(
        aom_memalign(kDataAlignment, 128 * 128 * sizeof(uint16_t)));
    ASSERT_NE(comp_pred16_test_, nullptr);
  }